

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

D_Parser * new_D_Parser(D_ParserTables *t,int sizeof_ParseNode_User)

{
  D_Parser *pDVar1;
  code *pcVar2;
  
  pDVar1 = (D_Parser *)calloc(1,0x1b8);
  pDVar1[1].initial_scope = (D_Scope *)t;
  (pDVar1->loc).line = 1;
  pDVar1->sizeof_user_parse_node = sizeof_ParseNode_User;
  pDVar1->commit_actions_interval = 100;
  pDVar1->error_recovery = 1;
  pDVar1->syntax_error_fn = syntax_error_report_fn;
  pDVar1->ambiguity_fn = ambiguity_abort_fn;
  pDVar1->save_parse_tree = t->save_parse_tree;
  pcVar2 = t->default_white_space;
  if (pcVar2 == (D_WhiteSpaceFn)0x0) {
    if (t->whitespace_state == 0) {
      pcVar2 = white_space;
    }
    else {
      pcVar2 = parse_whitespace;
    }
  }
  pDVar1->initial_white_space_fn = pcVar2;
  return pDVar1;
}

Assistant:

D_Parser *new_D_Parser(D_ParserTables *t, int sizeof_ParseNode_User) {
  Parser *p = MALLOC(sizeof(Parser));
  memset(p, 0, sizeof(Parser));
  p->t = t;
  p->user.loc.line = 1;
  p->user.sizeof_user_parse_node = sizeof_ParseNode_User;
  p->user.commit_actions_interval = DEFAULT_COMMIT_ACTIONS_INTERVAL;
  p->user.syntax_error_fn = syntax_error_report_fn;
  p->user.ambiguity_fn = ambiguity_abort_fn;
  p->user.error_recovery = 1;
  p->user.save_parse_tree = t->save_parse_tree;
  if (p->t->default_white_space)
    p->user.initial_white_space_fn = p->t->default_white_space;
  else if (p->t->whitespace_state)
    p->user.initial_white_space_fn = parse_whitespace;
  else
    p->user.initial_white_space_fn = white_space;
  return (D_Parser *)p;
}